

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oss.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_26d854::OSScapture::~OSScapture(OSScapture *this)

{
  RingBuffer *ptr;
  
  if (this->mFd != -1) {
    close(this->mFd);
  }
  this->mFd = -1;
  if ((this->mThread)._M_id._M_thread == 0) {
    ptr = (this->mRing)._M_t.super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>.
          _M_t.super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
          super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl;
    if (ptr != (RingBuffer *)0x0) {
      al_free(ptr);
    }
    (this->mRing)._M_t.super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>._M_t.
    super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
    super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl = (RingBuffer *)0x0;
    return;
  }
  std::terminate();
}

Assistant:

OSScapture::~OSScapture()
{
    if(mFd != -1)
        close(mFd);
    mFd = -1;
}